

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcondvariable-posix.c
# Opt level: O0

pboolean p_cond_variable_signal(PCondVariable *cond)

{
  int iVar1;
  PCondVariable *cond_local;
  
  if (cond == (PCondVariable *)0x0) {
    cond_local._4_4_ = 0;
  }
  else {
    iVar1 = pthread_cond_signal((pthread_cond_t *)cond);
    if (iVar1 == 0) {
      cond_local._4_4_ = 1;
    }
    else {
      printf("** Error: %s **\n",
             "PCondVariable::p_cond_variable_signal: pthread_cond_signal() failed");
      cond_local._4_4_ = 0;
    }
  }
  return cond_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_cond_variable_signal (PCondVariable *cond)
{
	if (P_UNLIKELY (cond == NULL))
		return FALSE;

	if (P_UNLIKELY (pthread_cond_signal (&cond->hdl) != 0)) {
		P_ERROR ("PCondVariable::p_cond_variable_signal: pthread_cond_signal() failed");
		return FALSE;
	}

	return TRUE;
}